

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaDeviceMemoryBlock::Unmap(VmaDeviceMemoryBlock *this,VmaAllocator hAllocator,uint32_t count)

{
  uint32_t uVar1;
  uint in_EDX;
  VmaAllocator_T *in_RSI;
  VmaMutexLock *in_RDI;
  uint32_t totalMapCount;
  VmaMutexLock lock;
  VmaVulkanFunctions *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffbc;
  
  if (in_EDX != 0) {
    VmaMutexLock::VmaMutexLock
              (in_RDI,(VmaMutex *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0));
    if (in_EDX <= *(uint *)((long)&in_RDI[10].m_pMutex + 4)) {
      *(uint *)((long)&in_RDI[10].m_pMutex + 4) = *(int *)((long)&in_RDI[10].m_pMutex + 4) - in_EDX;
      iVar2 = *(int *)((long)&in_RDI[10].m_pMutex + 4);
      uVar1 = VmaMappingHysteresis::GetExtraMapping((VmaMappingHysteresis *)(in_RDI + 9));
      if (iVar2 + uVar1 == 0) {
        in_RDI[0xb].m_pMutex = (VmaMutex *)0x0;
        in_stack_ffffffffffffffb0 = VmaAllocator_T::GetVulkanFunctions(in_RSI);
        (*in_stack_ffffffffffffffb0->vkUnmapMemory)
                  (in_RSI->m_hDevice,(VkDeviceMemory)in_RDI[3].m_pMutex);
      }
      VmaMappingHysteresis::PostUnmap((VmaMappingHysteresis *)in_stack_ffffffffffffffb0);
    }
    VmaMutexLock::~VmaMutexLock((VmaMutexLock *)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void VmaDeviceMemoryBlock::Unmap(VmaAllocator hAllocator, uint32_t count)
{
    if (count == 0)
    {
        return;
    }

    VmaMutexLock lock(m_MapAndBindMutex, hAllocator->m_UseMutex);
    if (m_MapCount >= count)
    {
        m_MapCount -= count;
        const uint32_t totalMapCount = m_MapCount + m_MappingHysteresis.GetExtraMapping();
        if (totalMapCount == 0)
        {
            m_pMappedData = VMA_NULL;
            (*hAllocator->GetVulkanFunctions().vkUnmapMemory)(hAllocator->m_hDevice, m_hMemory);
        }
        m_MappingHysteresis.PostUnmap();
    }
    else
    {
        VMA_ASSERT(0 && "VkDeviceMemory block is being unmapped while it was not previously mapped.");
    }
}